

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

ssize_t base64_decode_using_maps
                  (base64_maps_t *maps,char *dest,size_t destlen,char *src,size_t srclen)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  size_t more;
  ssize_t i;
  ssize_t dest_offset;
  size_t srclen_local;
  char *src_local;
  size_t destlen_local;
  char *dest_local;
  base64_maps_t *maps_local;
  
  i = 0;
  sVar2 = base64_decoded_length(srclen);
  if (destlen < sVar2) {
    piVar3 = __errno_location();
    *piVar3 = 0x4b;
    maps_local = (base64_maps_t *)0xffffffffffffffff;
  }
  else {
    for (more = 0; 4 < srclen - more; more = more + 4) {
      iVar1 = base64_decode_quartet_using_maps(maps,dest + i,src + more);
      if (iVar1 == -1) {
        return -1;
      }
      i = i + 3;
    }
    iVar1 = base64_decode_tail_using_maps(maps,dest + i,src + more,srclen - more);
    if ((long)iVar1 == -1) {
      maps_local = (base64_maps_t *)0xffffffffffffffff;
    }
    else {
      maps_local = (base64_maps_t *)(iVar1 + i);
      memset(dest + (long)maps_local,0,destlen - (long)maps_local);
    }
  }
  return (ssize_t)maps_local;
}

Assistant:

ssize_t base64_decode_using_maps(const base64_maps_t *maps,
				 char *dest, const size_t destlen,
				 const char *src, const size_t srclen)
{
	ssize_t dest_offset = 0;
	ssize_t i;
	size_t more;

	if (destlen < base64_decoded_length(srclen)) {
		errno = EOVERFLOW;
		return -1;
	}

	for(i=0; srclen - i > 4; i+=4) {
		if (base64_decode_quartet_using_maps(maps, &dest[dest_offset], &src[i]) == -1) {
			return -1;
		}
		dest_offset += 3;
	}

	more = base64_decode_tail_using_maps(maps, &dest[dest_offset], &src[i], srclen - i);
	if (more == -1) {
		return -1;
	}
	dest_offset += more;

	memset(&dest[dest_offset], '\0', destlen-dest_offset);

	return dest_offset;
}